

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

boolean same_price(obj *obj1,obj *obj2)

{
  bool local_3a;
  bool local_39;
  bill_x *pbStack_38;
  boolean are_mergable;
  bill_x *bp2;
  bill_x *bp1;
  monst *shkp2;
  monst *shkp1;
  obj *obj2_local;
  obj *obj1_local;
  
  bp2 = (bill_x *)0x0;
  pbStack_38 = (bill_x *)0x0;
  local_39 = false;
  shkp2 = next_shkp(level->monlist,'\x01');
  while ((shkp2 != (monst *)0x0 && (bp2 = onbill(obj1,shkp2,'\x01'), bp2 == (bill_x *)0x0))) {
    shkp2 = next_shkp(shkp2->nmon,'\x01');
  }
  if ((shkp2 == (monst *)0x0) ||
     (pbStack_38 = onbill(obj2,shkp2,'\x01'), pbStack_38 == (bill_x *)0x0)) {
    bp1 = (bill_x *)next_shkp(level->monlist,'\x01');
    while ((bp1 != (bill_x *)0x0 &&
           (pbStack_38 = onbill(obj2,(monst *)bp1,'\x01'), pbStack_38 == (bill_x *)0x0))) {
      bp1 = (bill_x *)next_shkp(*(monst **)bp1,'\x01');
    }
  }
  else {
    bp1 = (bill_x *)shkp2;
  }
  if ((bp2 == (bill_x *)0x0) || (pbStack_38 == (bill_x *)0x0)) {
    warning("same_price: object wasn\'t on any bill!");
  }
  else {
    local_3a = false;
    if (shkp2 == (monst *)bp1) {
      local_3a = bp2->price == pbStack_38->price;
    }
    local_39 = local_3a;
  }
  return local_39;
}

Assistant:

boolean same_price(struct obj *obj1, struct obj *obj2)
{
	struct monst *shkp1, *shkp2;
	struct bill_x *bp1 = 0, *bp2 = 0;
	boolean are_mergable = FALSE;

	/* look up the first object by finding shk whose bill it's on */
	for (shkp1 = next_shkp(level->monlist, TRUE); shkp1;
		shkp1 = next_shkp(shkp1->nmon, TRUE))
	    if ((bp1 = onbill(obj1, shkp1, TRUE)) != 0) break;
	/* second object is probably owned by same shk; if not, look harder */
	if (shkp1 && (bp2 = onbill(obj2, shkp1, TRUE)) != 0) {
	    shkp2 = shkp1;
	} else {
	    for (shkp2 = next_shkp(level->monlist, TRUE); shkp2;
		    shkp2 = next_shkp(shkp2->nmon, TRUE))
		if ((bp2 = onbill(obj2, shkp2, TRUE)) != 0) break;
	}

	if (!bp1 || !bp2) warning("same_price: object wasn't on any bill!");
	else are_mergable = (shkp1 == shkp2 && bp1->price == bp2->price);
	return are_mergable;
}